

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_arithmetic.cpp
# Opt level: O2

bool dxil_spv::emit_dxil_std450_unary_instruction
               (GLSLstd450 opcode,Impl *impl,CallInst *instruction)

{
  bool bVar1;
  bool bVar2;
  Id IVar3;
  BinaryOps BVar4;
  uint uVar5;
  Id type_id;
  Builder *pBVar6;
  Value *pVVar7;
  CallInst *pCVar8;
  Operation *this;
  BinaryOperator *pBVar9;
  Value *pVVar10;
  Constant *pCVar11;
  Value *value;
  Value *pVVar12;
  APFloat *this_00;
  Type *pTVar13;
  Operation *this_01;
  uint i;
  uint index;
  double dVar14;
  pair<const_LLVMBC::Value_*,_double> pVar15;
  ThreadLocalAllocator<char> local_81;
  Value *mul_value;
  Value *local_78;
  double local_70;
  double local_68;
  double local_60;
  Constant *local_58;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_50;
  
  pBVar6 = Converter::Impl::builder(impl);
  if (opcode - GLSLstd450Exp2 < 2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::basic_string(&local_50,"dx.precise",&local_81);
    bVar1 = LLVMBC::Instruction::hasMetadata(&instruction->super_Instruction,&local_50);
    bVar2 = (impl->options).force_precise;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::_M_dispose(&local_50);
    if ((!bVar1) && ((bVar2 & 1U) == 0)) {
      if (opcode == GLSLstd450Exp2) {
        pVVar7 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
        bVar2 = value_is_dx_op_instrinsic(pVVar7,Log);
        if (bVar2) goto LAB_00158684;
      }
      pVVar7 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
      bVar2 = value_is_dx_op_instrinsic(pVVar7,Exp);
      if (bVar2) {
LAB_00158684:
        pVVar7 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
        pCVar8 = LLVMBC::cast<LLVMBC::CallInst>(pVVar7);
        pVVar7 = LLVMBC::Instruction::getOperand(&pCVar8->super_Instruction,1);
        IVar3 = Converter::Impl::get_id_for_value(impl,pVVar7,0);
        Converter::Impl::rewrite_value(impl,(Value *)instruction,IVar3);
        return true;
      }
    }
  }
  if (impl->glsl_std450_ext == 0) {
    IVar3 = spv::Builder::import(pBVar6,"GLSL.std.450");
    impl->glsl_std450_ext = IVar3;
  }
  this = Converter::Impl::allocate(impl,OpExtInst,(Value *)instruction);
  Operation::add_id(this,impl->glsl_std450_ext);
  Operation::add_literal(this,opcode);
  pVVar7 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  IVar3 = Converter::Impl::get_id_for_value(impl,pVVar7,0);
  if (opcode == GLSLstd450Sqrt) {
    pVVar7 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    pBVar9 = LLVMBC::dyn_cast<LLVMBC::BinaryOperator>(pVVar7);
    if (((pBVar9 != (BinaryOperator *)0x0) &&
        (BVar4 = LLVMBC::BinaryOperator::getOpcode(pBVar9), BVar4 == FSub)) &&
       (bVar2 = LLVMBC::BinaryOperator::isFast(pBVar9), bVar2)) {
      pVVar10 = LLVMBC::Instruction::getOperand(&pBVar9->super_Instruction,0);
      pCVar11 = &LLVMBC::dyn_cast<LLVMBC::ConstantFP>(pVVar10)->super_Constant;
      if (pCVar11 != (Constant *)0x0) {
        local_58 = pCVar11;
        pVVar10 = LLVMBC::Instruction::getOperand(&pBVar9->super_Instruction,1);
        pVar15 = split_constant_multipliers(pVVar10);
        local_70 = pVar15.second;
        if (pVar15.first != (Value *)0x0) {
          pBVar9 = LLVMBC::dyn_cast<LLVMBC::BinaryOperator>(pVar15.first);
          if ((pBVar9 == (BinaryOperator *)0x0) ||
             (BVar4 = LLVMBC::BinaryOperator::getOpcode(pBVar9), BVar4 != FMul)) goto LAB_001589cd;
          local_78 = LLVMBC::Instruction::getOperand(&pBVar9->super_Instruction,0);
          index = 1;
          value = LLVMBC::Instruction::getOperand(&pBVar9->super_Instruction,1);
          pVar15 = split_constant_multipliers(local_78);
          local_68 = pVar15.second;
          mul_value = pVar15.first;
          pVar15 = split_constant_multipliers(value);
          pVVar10 = mul_value;
          pVVar12 = pVar15.first;
          if ((local_68 < 0.0) || (pVar15.second < 0.0)) goto LAB_001589cd;
          if (mul_value != (Value *)0x0) {
            local_78 = mul_value;
          }
          if (pVVar12 != (Value *)0x0) {
            value = pVVar12;
          }
          mul_value = pVVar12;
          local_60 = pVar15.second;
          bVar2 = is_canonically_normalizing_value(pVVar10);
          bVar1 = is_canonically_normalizing_value(mul_value);
          mul_value = local_78;
          if (bVar2) {
            mul_value = value;
          }
          if (!bVar1 && !bVar2) goto LAB_001589cd;
          if (bVar2) {
            value = local_78;
          }
          pCVar8 = LLVMBC::cast<LLVMBC::CallInst>(value);
          pVVar10 = LLVMBC::Instruction::getOperand(&pCVar8->super_Instruction,1);
          pCVar8 = LLVMBC::cast<LLVMBC::CallInst>(pVVar10);
          do {
            uVar5 = LLVMBC::Instruction::getNumOperands(&pCVar8->super_Instruction);
            if (uVar5 <= index) goto LAB_001589cd;
            pVVar10 = LLVMBC::Instruction::getOperand(&pCVar8->super_Instruction,index);
            index = index + 1;
          } while (pVVar10 != mul_value);
          local_70 = local_70 * local_68 * local_60;
        }
        this_00 = LLVMBC::Constant::getValueAPF(local_58);
        dVar14 = LLVMBC::APFloat::convertToDouble(this_00);
        if ((local_70 != 0.0) || (NAN(local_70))) {
          if ((dVar14 == local_70) && (!NAN(dVar14) && !NAN(local_70))) {
            pTVar13 = LLVMBC::Value::getType(pVVar7);
            type_id = Converter::Impl::get_type_id(impl,pTVar13,0);
            this_01 = Converter::Impl::allocate(impl,OpExtInst,type_id);
            Operation::add_id(this_01,impl->glsl_std450_ext);
            Operation::add_literal(this_01,0x28);
            Operation::add_id(this_01,IVar3);
            pBVar6 = Converter::Impl::builder(impl);
            IVar3 = spv::Builder::makeNullConstant(pBVar6,this_01->type_id);
            Operation::add_id(this_01,IVar3);
            Converter::Impl::add(impl,this_01,false);
            IVar3 = this_01->id;
          }
        }
      }
    }
  }
LAB_001589cd:
  Operation::add_id(this,IVar3);
  Converter::Impl::add(impl,this,false);
  pTVar13 = LLVMBC::Value::getType((Value *)instruction);
  Converter::Impl::decorate_relaxed_precision(impl,pTVar13,this->id,false);
  return true;
}

Assistant:

bool emit_dxil_std450_unary_instruction(GLSLstd450 opcode, Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	// Games rely on this peephole, since DXC doesn't do it for us.
	if (opcode == GLSLstd450Exp2 || opcode == GLSLstd450Log2)
	{
		bool precise = instruction->hasMetadata("dx.precise") || impl.options.force_precise;
		if (!precise)
		{
			if ((opcode == GLSLstd450Exp2 && value_is_dx_op_instrinsic(instruction->getOperand(1), DXIL::Op::Log)) ||
			    (value_is_dx_op_instrinsic(instruction->getOperand(1), DXIL::Op::Exp)))
			{
				auto *base_value = llvm::cast<llvm::CallInst>(instruction->getOperand(1))->getOperand(1);
				impl.rewrite_value(instruction, impl.get_id_for_value(base_value));
				return true;
			}
		}
	}

	if (!impl.glsl_std450_ext)
		impl.glsl_std450_ext = builder.import("GLSL.std.450");

	Operation *op = impl.allocate(spv::OpExtInst, instruction);
	op->add_id(impl.glsl_std450_ext);
	op->add_literal(opcode);

	spv::Id id = impl.get_id_for_value(instruction->getOperand(1));
	if (opcode == GLSLstd450Sqrt)
		id = build_clamped_non_negative_sqrt(impl, id, instruction->getOperand(1));

	op->add_id(id);

	impl.add(op);
	impl.decorate_relaxed_precision(instruction->getType(), op->id, false);
	return true;
}